

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_PartialEquivalencyNotEqualTest_Test::
TestBody(MessageDifferencerTest_PartialEquivalencyNotEqualTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_8e0;
  AssertHelper local_8c0;
  Message local_8b8;
  bool local_8a9;
  undefined1 local_8a8 [8];
  AssertionResult gtest_ar__1;
  MessageDifferencer differencer;
  AssertHelper local_6c8;
  Message local_6c0;
  bool local_6b1;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_690 [8];
  TestAllTypes msg2;
  TestAllTypes msg1;
  MessageDifferencerTest_PartialEquivalencyNotEqualTest_Test *this_local;
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_690);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>((TestAllTypes *)local_690);
  proto2_unittest::TestAllTypes::set_optional_int32((TestAllTypes *)((long)&msg2.field_0 + 0x328),0)
  ;
  proto2_unittest::TestAllTypes::clear_optional_int32((TestAllTypes *)local_690);
  bVar1 = util::MessageDifferencer::Equals
                    ((Message *)((long)&msg2.field_0 + 0x328),(Message *)local_690);
  local_6b1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6b0,&local_6b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
  if (!bVar1) {
    testing::Message::Message(&local_6c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&differencer.unpack_any_field_,(internal *)local_6b0,
               (AssertionResult *)"util::MessageDifferencer::Equals(msg1, msg2)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x30e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6c8,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper(&local_6c8);
    std::__cxx11::string::~string((string *)&differencer.unpack_any_field_);
    testing::Message::~Message(&local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)&gtest_ar__1.message_);
  util::MessageDifferencer::set_message_field_comparison
            ((MessageDifferencer *)&gtest_ar__1.message_,EQUIVALENT);
  util::MessageDifferencer::set_scope((MessageDifferencer *)&gtest_ar__1.message_,PARTIAL);
  local_8a9 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)&gtest_ar__1.message_,
                         (Message *)((long)&msg2.field_0 + 0x328),(Message *)local_690);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8a8,&local_8a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a8);
  if (!bVar1) {
    testing::Message::Message(&local_8b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8e0,(internal *)local_8a8,(AssertionResult *)0x1ebd035,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x313,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8c0,&local_8b8);
    testing::internal::AssertHelper::~AssertHelper(&local_8c0);
    std::__cxx11::string::~string((string *)&local_8e0);
    testing::Message::~Message(&local_8b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a8);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)&gtest_ar__1.message_);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_690);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  return;
}

Assistant:

TEST(MessageDifferencerTest, PartialEquivalencyNotEqualTest) {
  // Create the testing protos
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  TestUtil::SetAllFields(&msg1);
  TestUtil::SetAllFields(&msg2);

  msg1.set_optional_int32(0);
  msg2.clear_optional_int32();

  // Compare
  EXPECT_FALSE(util::MessageDifferencer::Equals(msg1, msg2));
  util::MessageDifferencer differencer;
  differencer.set_message_field_comparison(
      util::MessageDifferencer::EQUIVALENT);
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}